

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_ArraySpeciesCreate(JSContext *ctx,JSValue obj,JSValue len_val)

{
  short sVar1;
  BOOL BVar2;
  uint uVar3;
  JSContext *pJVar4;
  int iVar5;
  int64_t iVar6;
  JSRefCountHeader *p_1;
  JSRefCountHeader *p;
  ulong uVar7;
  JSValueUnion JVar8;
  JSValue JVar9;
  JSValue JVar10;
  JSValue JVar11;
  JSValue new_target;
  JSValueUnion local_40;
  int64_t local_38;
  
  local_38 = len_val.tag;
  local_40 = len_val.u;
  if ((int)obj.tag == -1) {
    sVar1 = *(short *)((long)obj.u.ptr + 6);
    if (sVar1 == 0x29) {
      uVar3 = js_proxy_isArray(ctx,obj);
      if (-1 < (int)uVar3) goto LAB_00163e14;
LAB_00164048:
      uVar7 = 0;
      JVar9 = (JSValue)(ZEXT816(6) << 0x40);
      goto LAB_00163f0f;
    }
    uVar3 = (uint)(sVar1 == 2);
LAB_00163e14:
    if (uVar3 != 0) {
      JVar9 = JS_GetPropertyInternal(ctx,obj,0x3c,obj,0);
      JVar8 = JVar9.u;
      uVar7 = (ulong)JVar8.ptr & 0xffffffff00000000;
      iVar5 = (int)JVar9.tag;
      if (iVar5 == 6) goto LAB_00163f0f;
      if ((iVar5 == -1) && ((*(byte *)((long)JVar8.ptr + 5) & 0x10) != 0)) {
        pJVar4 = JS_GetFunctionRealm(ctx,JVar9);
        if (pJVar4 == (JSContext *)0x0) {
          iVar5 = *JVar8.ptr;
          *(int *)JVar8.ptr = iVar5 + -1;
          if (iVar5 < 2) {
            __JS_FreeValueRT(ctx->rt,JVar9);
          }
          goto LAB_00164048;
        }
        if ((pJVar4 == ctx) || (BVar2 = js_same_value(ctx,JVar9,pJVar4->array_ctor), BVar2 == 0))
        goto LAB_00163e6d;
        iVar5 = *JVar8.ptr;
        *(int *)JVar8.ptr = iVar5 + -1;
        if (iVar5 < 2) {
          __JS_FreeValueRT(ctx->rt,JVar9);
        }
      }
      else {
LAB_00163e6d:
        JVar10 = JVar9;
        if ((JVar9.tag & 0xffffffffU) == 0xffffffff) {
          JVar10 = JS_GetPropertyInternal(ctx,JVar9,0xcf,JVar9,0);
          iVar5 = *JVar8.ptr;
          *(int *)JVar8.ptr = iVar5 + -1;
          if (iVar5 < 2) {
            __JS_FreeValueRT(ctx->rt,JVar9);
          }
          iVar5 = (int)JVar10.tag;
          if (iVar5 == 2) goto LAB_00163f94;
          uVar7 = (ulong)JVar10.u.ptr & 0xffffffff00000000;
          JVar9 = JVar10;
          if (iVar5 == 6) goto LAB_00163f0f;
        }
        iVar6 = JVar10.tag;
        if (iVar5 != 3) {
          JVar8.ptr = (void *)(uVar7 | (ulong)JVar10.u.ptr & 0xffffffff);
          JVar9.tag = iVar6;
          JVar9.u.ptr = JVar8.ptr;
          new_target.tag = iVar6;
          new_target.u.ptr = JVar8.ptr;
          JVar9 = JS_CallConstructorInternal(ctx,JVar9,new_target,1,(JSValue *)&local_40,2);
          if ((0xfffffff4 < (uint)JVar10.tag) &&
             (iVar5 = *JVar8.ptr, *(int *)JVar8.ptr = iVar5 + -1, iVar5 < 2)) {
            JVar10.tag = iVar6;
            JVar10.u.ptr = JVar8.ptr;
            __JS_FreeValueRT(ctx->rt,JVar10);
          }
          uVar7 = (ulong)JVar9.u.ptr & 0xffffffff00000000;
          goto LAB_00163f0f;
        }
      }
LAB_00163f94:
      JVar9 = js_array_constructor(ctx,(JSValue)(ZEXT816(3) << 0x40),1,(JSValue *)&local_40);
      uVar7 = (ulong)JVar9.u.ptr & 0xffffffff00000000;
      goto LAB_00163f0f;
    }
  }
  JVar9 = js_array_constructor(ctx,(JSValue)(ZEXT816(3) << 0x40),1,(JSValue *)&local_40);
  uVar7 = (ulong)JVar9.u.ptr & 0xffffffff00000000;
LAB_00163f0f:
  JVar11.u.ptr = (void *)((ulong)JVar9.u.ptr & 0xffffffff | uVar7);
  JVar11.tag = JVar9.tag;
  return JVar11;
}

Assistant:

static JSValue JS_ArraySpeciesCreate(JSContext *ctx, JSValueConst obj,
                                     JSValueConst len_val)
{
    JSValue ctor, ret, species;
    int res;
    JSContext *realm;
    
    res = JS_IsArray(ctx, obj);
    if (res < 0)
        return JS_EXCEPTION;
    if (!res)
        return js_array_constructor(ctx, JS_UNDEFINED, 1, &len_val);
    ctor = JS_GetProperty(ctx, obj, JS_ATOM_constructor);
    if (JS_IsException(ctor))
        return ctor;
    if (JS_IsConstructor(ctx, ctor)) {
        /* legacy web compatibility */
        realm = JS_GetFunctionRealm(ctx, ctor);
        if (!realm) {
            JS_FreeValue(ctx, ctor);
            return JS_EXCEPTION;
        }
        if (realm != ctx &&
            js_same_value(ctx, ctor, realm->array_ctor)) {
            JS_FreeValue(ctx, ctor);
            ctor = JS_UNDEFINED;
        }
    }
    if (JS_IsObject(ctor)) {
        species = JS_GetProperty(ctx, ctor, JS_ATOM_Symbol_species);
        JS_FreeValue(ctx, ctor);
        if (JS_IsException(species))
            return species;
        ctor = species;
        if (JS_IsNull(ctor))
            ctor = JS_UNDEFINED;
    }
    if (JS_IsUndefined(ctor)) {
        return js_array_constructor(ctx, JS_UNDEFINED, 1, &len_val);
    } else {
        ret = JS_CallConstructor(ctx, ctor, 1, &len_val);
        JS_FreeValue(ctx, ctor);
        return ret;
    }
}